

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_del(void *p,HistEvent *ev,int num)

{
  int iVar1;
  char *pcVar2;
  history_t *h;
  int num_local;
  HistEvent *ev_local;
  void *p_local;
  
  iVar1 = history_def_set(p,ev,num);
  if (iVar1 == 0) {
    pcVar2 = strdup(*(char **)(*(long *)((long)p + 0x28) + 8));
    ev->str = pcVar2;
    ev->num = **(int **)((long)p + 0x28);
    history_def_delete((history_t *)p,ev,*(hentry_t_conflict **)((long)p + 0x28));
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_del(void *p, TYPE(HistEvent) *ev __attribute__((__unused__)),
    const int num)
{
	history_t *h = (history_t *) p;
	if (history_def_set(h, ev, num) != 0)
		return -1;
	ev->str = Strdup(h->cursor->ev.str);
	ev->num = h->cursor->ev.num;
	history_def_delete(h, ev, h->cursor);
	return 0;
}